

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O2

void __thiscall
libtorrent::web_connection_base::web_connection_base
          (web_connection_base *this,peer_connection_args *pack,web_seed_t *web)

{
  string *s;
  int *piVar1;
  bool bVar2;
  error_code ec;
  string protocol;
  string local_100;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  string *local_58;
  int *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  peer_connection::peer_connection(&this->super_peer_connection,pack);
  (this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket =
       (_func_int **)&PTR_assign_bandwidth_00430210;
  (this->super_peer_connection).super_disk_observer._vptr_disk_observer =
       (_func_int **)&DAT_004303d8;
  (this->super_peer_connection).super_peer_connection_interface._vptr_peer_connection_interface =
       (_func_int **)&PTR_remote_004303f0;
  (this->super_peer_connection).super_error_handler_interface._vptr_error_handler_interface =
       (_func_int **)&PTR_on_exception_00430488;
  *(undefined2 *)&(this->super_peer_connection).field_0x764 = 1;
  std::_Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::_Deque_base
            (&(this->m_requests).
              super__Deque_base<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
            );
  (this->m_server_string)._M_dataplus._M_p = (pointer)&(this->m_server_string).field_2;
  (this->m_server_string)._M_string_length = 0;
  (this->m_server_string).field_2._M_local_buf[0] = '\0';
  (this->m_basic_auth)._M_dataplus._M_p = (pointer)&(this->m_basic_auth).field_2;
  (this->m_basic_auth)._M_string_length = 0;
  (this->m_basic_auth).field_2._M_local_buf[0] = '\0';
  (this->m_host)._M_dataplus._M_p = (pointer)&(this->m_host).field_2;
  (this->m_host)._M_string_length = 0;
  s = &this->m_basic_auth;
  (this->m_host).field_2._M_local_buf[0] = '\0';
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  (this->m_path)._M_string_length = 0;
  (this->m_path).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&this->m_external_auth,(string *)&(web->super_web_seed_entry).auth);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&this->m_extra_headers,&(web->super_web_seed_entry).extra_headers);
  http_parser::http_parser(&this->m_parser,1);
  this->m_body_start = 0;
  protocol._M_dataplus._M_p = (pointer)&protocol.field_2;
  protocol._M_string_length = 0;
  ec.val_ = 0;
  protocol.field_2._M_local_buf[0] = '\0';
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  std::__cxx11::string::string((string *)&local_100,(string *)web);
  parse_url_components
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_e0,&local_100,&ec);
  piVar1 = &this->m_port;
  local_38 = &protocol;
  local_58 = &this->m_path;
  local_50 = piVar1;
  local_48 = &this->m_host;
  local_40 = s;
  std::
  tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
  ::operator=((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,std::__cxx11::string&>
               *)&local_58,
              (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_e0);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl(&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  if (this->m_port == -1) {
    bVar2 = std::operator==(&protocol,"http");
    if (bVar2) {
      *piVar1 = 0x50;
    }
  }
  bVar2 = std::operator==(&protocol,"https");
  if ((bVar2) && ((this->super_peer_connection).field_0x765 = 1, this->m_port == -1)) {
    *piVar1 = 0x1bb;
  }
  if ((this->m_basic_auth)._M_string_length != 0) {
    base64encode((string *)&local_e0,s);
    std::__cxx11::string::operator=((string *)s,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::__cxx11::string::assign((char *)&this->m_server_string);
  std::__cxx11::string::append((string *)&this->m_server_string);
  std::__cxx11::string::~string((string *)&protocol);
  return;
}

Assistant:

web_connection_base::web_connection_base(
		peer_connection_args const& pack
		, web_seed_t& web)
		: peer_connection(pack)
		, m_first_request(true)
		, m_ssl(false)
		, m_external_auth(web.auth)
		, m_extra_headers(web.extra_headers)
		, m_parser(http_parser::dont_parse_chunks)
		, m_body_start(0)
	{
		TORRENT_ASSERT(&web.peer_info == pack.peerinfo);
		// when going through a proxy, we don't necessarily have an endpoint here,
		// since the proxy might be resolving the hostname, not us
		TORRENT_ASSERT(web.endpoints.empty() || web.endpoints.front() == pack.endp);

		INVARIANT_CHECK;

		TORRENT_ASSERT(is_outgoing());

		TORRENT_ASSERT(!m_torrent.lock()->is_upload_only());

		// we only want left-over bandwidth
		// TODO: introduce a web-seed default class which has a low download priority

		std::string protocol;
		error_code ec;
		std::tie(protocol, m_basic_auth, m_host, m_port, m_path)
			= parse_url_components(web.url, ec);
		TORRENT_ASSERT(!ec);

		if (m_port == -1 && protocol == "http")
			m_port = 80;

#ifdef TORRENT_USE_OPENSSL
		if (protocol == "https")
		{
			m_ssl = true;
			if (m_port == -1) m_port = 443;
		}
#endif

		if (!m_basic_auth.empty())
			m_basic_auth = base64encode(m_basic_auth);

		m_server_string = "URL seed @ ";
		m_server_string += m_host;
	}